

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

void AI::pruneOldEngramsImpl
               (vector<AI::Engram,_std::allocator<AI::Engram>_> *engrams,int *focus,
               bool maintainOrder)

{
  pointer *ppEVar1;
  StimulusType *pSVar2;
  int iVar3;
  pointer pEVar4;
  pointer pEVar5;
  pointer pEVar6;
  undefined8 uVar7;
  Actor *pAVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  pointer piVar15;
  undefined7 in_register_00000011;
  vector<int,_std::allocator<int>_> *__range2;
  int i;
  int iVar16;
  vector<int,_std::allocator<int>_> oldIds;
  int i_1;
  undefined4 uStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  Actor *pAStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((int)CONCAT71(in_register_00000011,maintainOrder) == 0) {
    oldIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    oldIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    oldIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    _i_1 = _i_1 & 0xffffffff00000000;
    pEVar4 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pEVar5 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar16 = 0;
    while (iVar16 < (int)(((long)pEVar4 - (long)pEVar5) / 0x30)) {
      if ((300 < (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar16].age) && (*focus != iVar16)) {
        std::vector<int,_std::allocator<int>_>::push_back(&oldIds,&i_1);
        iVar16 = i_1;
      }
      iVar16 = iVar16 + 1;
      _i_1 = CONCAT44(uStack_64,iVar16);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
              (oldIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,oldIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    iVar16 = *focus;
    for (piVar15 = oldIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar15 !=
        oldIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish; piVar15 = piVar15 + 1) {
      iVar3 = *piVar15;
      pEVar5 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pEVar6 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pEVar4 = pEVar5 + iVar3;
      i_1 = (int)(pEVar4->stimulus).x;
      uStack_64 = (pEVar4->stimulus).y;
      uStack_60 = *(undefined8 *)&(pEVar4->stimulus).intensity;
      local_58 = *(undefined8 *)&pEVar5[iVar3].stimulus.field_3;
      pAStack_50 = pEVar5[iVar3].stimulus.field_3.visual.target;
      pSVar2 = &pEVar5[iVar3].stimulus.type;
      local_48 = *(undefined8 *)pSVar2;
      uStack_40 = *(undefined8 *)(pSVar2 + 2);
      fVar11 = pEVar6[-1].stimulus.x;
      fVar12 = pEVar6[-1].stimulus.y;
      fVar13 = pEVar6[-1].stimulus.intensity;
      uVar14 = *(undefined4 *)&pEVar6[-1].stimulus.field_0xc;
      uVar7 = *(undefined8 *)&pEVar6[-1].stimulus.field_3;
      pAVar8 = pEVar6[-1].stimulus.field_3.visual.target;
      uVar10 = *(undefined4 *)&pEVar6[-1].stimulus.field_0x24;
      uVar9 = *(undefined8 *)&pEVar6[-1].type;
      pEVar4 = pEVar5 + iVar3;
      (pEVar4->stimulus).type = pEVar6[-1].stimulus.type;
      *(undefined4 *)&(pEVar4->stimulus).field_0x24 = uVar10;
      *(undefined8 *)(&(pEVar4->stimulus).type + 2) = uVar9;
      *(undefined8 *)&pEVar5[iVar3].stimulus.field_3 = uVar7;
      pEVar5[iVar3].stimulus.field_3.visual.target = pAVar8;
      pEVar5 = pEVar5 + iVar3;
      (pEVar5->stimulus).x = fVar11;
      (pEVar5->stimulus).y = fVar12;
      (pEVar5->stimulus).intensity = fVar13;
      *(undefined4 *)&(pEVar5->stimulus).field_0xc = uVar14;
      *(undefined8 *)&pEVar6[-1].stimulus.type = local_48;
      pEVar6[-1].type = (int)uStack_40;
      pEVar6[-1].age = (int)((ulong)uStack_40 >> 0x20);
      *(undefined8 *)&pEVar6[-1].stimulus.field_3 = local_58;
      pEVar6[-1].stimulus.field_3.visual.target = pAStack_50;
      pEVar6[-1].stimulus.x = (float)i_1;
      pEVar6[-1].stimulus.y = (float)uStack_64;
      *(undefined8 *)&pEVar6[-1].stimulus.intensity = uStack_60;
      ppEVar1 = &(engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + -1;
      if (iVar3 < iVar16) {
        *focus = *focus + -1;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&oldIds.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    for (iVar16 = 0;
        pEVar4 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        iVar16 < (int)(((long)(engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4) / 0x30);
        iVar16 = iVar16 + 1) {
      if (300 < pEVar4[iVar16].age) {
        std::vector<AI::Engram,_std::allocator<AI::Engram>_>::erase(engrams,pEVar4 + iVar16);
        iVar16 = iVar16 + -1;
      }
    }
  }
  return;
}

Assistant:

void pruneOldEngramsImpl(std::vector<Engram>& engrams, int& focus, bool maintainOrder)
	{
		//A locus' engrams are sensitive to their order, so use a slower method to handle that case
		if (maintainOrder)
		{
			for (int i = 0; i < static_cast<int>(engrams.size()); i++)
			{
				if (engrams[i].age > MaxEngramAge)
				{
					engrams.erase(begin(engrams) + i);
					i--;
				}
			}
		}
		else
		{
			/*
			Order doesn't matter, so we can swap soon-to-be-removed engrams with the
			last engram to do a more efficient pop_back
			*/
			std::vector<int> oldIds;
			for(int i = 0, size = engrams.size(); i < size; i++)
			{
				if (engrams[i].age > MaxEngramAge
					&& focus != i)
				{
					oldIds.push_back(i);
				}
			}

			std::sort(begin(oldIds), end(oldIds), std::greater<int>());

			auto oldFocus = focus;
			int i = 0;
			for(auto id : oldIds)
			{
				std::swap(engrams[id], engrams.back());
				engrams.pop_back();
			
				if (id < oldFocus)
					focus--;

				i++;
			}
		}
		
	}